

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm.cpp
# Opt level: O3

int __thiscall ncnn::RMSNorm::load_model(RMSNorm *this,ModelBin *mb)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  int iVar3;
  void *local_68;
  int *local_60;
  size_t local_58;
  int local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  int local_30;
  size_t local_28;
  
  iVar3 = 0;
  if (this->affine != 0) {
    (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->affine_size,1);
    if (&this->gamma_data != (Mat *)&local_68) {
      if (local_60 != (int *)0x0) {
        LOCK();
        *local_60 = *local_60 + 1;
        UNLOCK();
      }
      piVar1 = (this->gamma_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          __ptr = (this->gamma_data).data;
          pAVar2 = (this->gamma_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->gamma_data).data = local_68;
      (this->gamma_data).refcount = local_60;
      (this->gamma_data).elemsize = local_58;
      (this->gamma_data).elempack = local_50;
      (this->gamma_data).allocator = local_48;
      (this->gamma_data).dims = local_40;
      (this->gamma_data).w = iStack_3c;
      (this->gamma_data).h = iStack_38;
      (this->gamma_data).d = iStack_34;
      (this->gamma_data).c = local_30;
      (this->gamma_data).cstep = local_28;
    }
    if (local_60 != (int *)0x0) {
      LOCK();
      *local_60 = *local_60 + -1;
      UNLOCK();
      if (*local_60 == 0) {
        if (local_48 == (Allocator *)0x0) {
          if (local_68 != (void *)0x0) {
            free(local_68);
          }
        }
        else {
          (*local_48->_vptr_Allocator[3])();
        }
      }
    }
    if (((this->gamma_data).data == (void *)0x0) ||
       (iVar3 = 0, (long)(this->gamma_data).c * (this->gamma_data).cstep == 0)) {
      iVar3 = -100;
    }
  }
  return iVar3;
}

Assistant:

int RMSNorm::load_model(const ModelBin& mb)
{
    if (affine == 0)
        return 0;

    gamma_data = mb.load(affine_size, 1);
    if (gamma_data.empty())
        return -100;

    return 0;
}